

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O3

int32_t ll_ftp_msg_process(ll_ftp_t *f,uint8_t *buf,uint8_t len)

{
  time *tp;
  ll_ftp_state_t lVar1;
  _Bool _Var2;
  uint16_t uVar3;
  int32_t iVar4;
  ll_ftp_return_code_t lVar5;
  ll_ftp_return_code_t lVar6;
  uint8_t uVar7;
  bool bVar8;
  ll_ftp_msg_t ftp_msg;
  ll_ftp_msg_t local_60;
  time local_38;
  
  lVar1 = f->state;
  if (lVar1 != APPLY) {
    if (lVar1 != SEGMENT) {
      if (lVar1 != IDLE) {
        return 4;
      }
      iVar4 = ll_ftp_parse_rx_msg(buf,len,&local_60);
      if (iVar4 != 0) {
        return iVar4;
      }
      if ((local_60.msg_type != TX_SEGMENT) && (local_60.msg_type != TX_INIT)) {
        return 2;
      }
      goto LAB_00104c8a;
    }
    iVar4 = ll_ftp_parse_rx_msg(buf,len,&local_60);
    if (iVar4 != 0) {
      return iVar4;
    }
    switch(local_60.msg_type) {
    case TX_INIT:
      goto switchD_001049e4_caseD_0;
    case TX_CANCEL:
      if (local_60.file_id != f->file_id) {
        return 3;
      }
      if (local_60.file_version != f->file_version) {
        return 3;
      }
      break;
    case TX_APPLY:
      uVar3 = ll_ftp_ack_segs_request_generate(f);
      uVar7 = ll_ul_max_port;
      ll_ul_max_port = 0x80;
      lVar6 = (*(f->cb).uplink)(f->tx_buf,uVar3,true,0x80);
      ll_ul_max_port = uVar7;
      gettime(&f->time_last_msg);
      return (uint)(lVar6 != LL_FTP_OK) << 2;
    case TX_SEGMENT:
      if ((local_60.file_id != f->file_id) || (local_60.file_version != f->file_version))
      goto LAB_00104c8a;
      tp = &f->time_last_msg;
      gettime(tp);
      f->retry_count = '\0';
      iVar4 = ll_ftp_write_segment(f,&local_60);
      _Var2 = ll_ftp_transfer_is_complete(f);
      if (!_Var2) {
        return iVar4;
      }
      iVar4 = ll_ftp_verify_file(f);
      if (iVar4 != 0) {
        memset(f->rx_segs,0,0x4cc);
        gettime(tp);
        f->retry_count = '\0';
        lVar6 = ll_ftp_file_reopen(f);
        if (lVar6 == LL_FTP_OK) {
          return 0;
        }
        break;
      }
      lVar6 = (*(f->cb).close)(f->file_id,f->file_version);
      if (lVar6 != LL_FTP_OK) {
LAB_00104e39:
        f->state = IDLE;
        goto LAB_00104dd6;
      }
      ll_ftp_ack_segs_complete_generate(f);
      uVar7 = ll_ul_max_port;
      ll_ul_max_port = 0x80;
      lVar6 = (*(f->cb).uplink)(f->tx_buf,0xe,true,0x80);
      ll_ul_max_port = uVar7;
      gettime(tp);
      if (lVar6 != LL_FTP_OK) goto LAB_00104e39;
      f->state = APPLY;
      goto LAB_00104cb2;
    default:
      return 3;
    case TICK:
      gettime(&local_38);
      iVar4 = ll_difftime(&f->time_last_msg,&local_38);
      if (iVar4 < 0x10) {
        return 0;
      }
      if (f->retry_count < 5) {
        uVar3 = ll_ftp_ack_segs_request_generate(f);
        uVar7 = ll_ul_max_port;
        goto LAB_00104d0b;
      }
    }
    lVar6 = (*(f->cb).close)(f->file_id,f->file_version);
    if (lVar6 != LL_FTP_OK) {
      return 4;
    }
    (*(f->cb).config)(false);
    f->state = IDLE;
    ll_ftp_init(f,&f->cb);
    return 0;
  }
  iVar4 = ll_ftp_parse_rx_msg(buf,len,&local_60);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = 3;
  switch(local_60.msg_type) {
  case TX_INIT:
switchD_001049e4_caseD_0:
    if ((local_60.file_id == f->file_id) && (local_60.file_version == f->file_version)) {
      return 3;
    }
    break;
  case TX_CANCEL:
    if (local_60.file_id != f->file_id) {
      return 3;
    }
    if (local_60.file_version != f->file_version) {
      return 3;
    }
    goto LAB_00104d7f;
  case TX_APPLY:
    if (local_60.file_id != f->file_id) {
      return 3;
    }
    if (local_60.file_version != f->file_version) {
      return 3;
    }
    lVar6 = (*(f->cb).apply)(local_60.file_id,local_60.file_version,f->file_size);
    ll_ftp_ack_apply_generate(f,lVar6 == LL_FTP_OK);
    uVar7 = ll_ul_max_port;
    ll_ul_max_port = 0x80;
    lVar5 = (*(f->cb).uplink)(f->tx_buf,0xe,true,0x80);
    ll_ul_max_port = uVar7;
    gettime(&f->time_last_msg);
    bVar8 = lVar5 != LL_FTP_OK || lVar6 != LL_FTP_OK;
    goto LAB_00104d82;
  case TX_SEGMENT:
    if ((local_60.file_id == f->file_id) && (local_60.file_version == f->file_version)) {
      gettime(&f->time_last_msg);
      f->retry_count = '\0';
      return 3;
    }
    break;
  default:
    goto switchD_001049e4_caseD_4;
  case TICK:
    gettime(&local_38);
    iVar4 = ll_difftime(&f->time_last_msg,&local_38);
    if (iVar4 < 0x10) {
      return 0;
    }
    if (f->retry_count < 5) {
      ll_ftp_ack_segs_complete_generate(f);
      uVar3 = 0xe;
      uVar7 = ll_ul_max_port;
LAB_00104d0b:
      ll_ul_max_port = 0x80;
      lVar6 = (*(f->cb).uplink)(f->tx_buf,uVar3,true,0x80);
      ll_ul_max_port = uVar7;
      gettime(&f->time_last_msg);
      f->retry_count = f->retry_count + '\x01';
      return (uint)(lVar6 != LL_FTP_OK) << 2;
    }
LAB_00104d7f:
    bVar8 = false;
LAB_00104d82:
    lVar6 = (*(f->cb).close)(f->file_id,f->file_version);
    if (lVar6 == LL_FTP_OK) {
      iVar4 = 0;
      (*(f->cb).config)(false);
      ll_ftp_init(f,&f->cb);
      f->state = IDLE;
    }
    else {
      ll_ftp_init(f,&f->cb);
      iVar4 = 4;
    }
    if (bVar8) {
LAB_00104dd6:
      iVar4 = 4;
    }
    goto switchD_001049e4_caseD_4;
  }
LAB_00104c8a:
  iVar4 = ll_ftp_segment_start(f,&local_60);
  if (iVar4 == 0) {
    f->state = SEGMENT;
LAB_00104cb2:
    iVar4 = 0;
  }
switchD_001049e4_caseD_4:
  return iVar4;
}

Assistant:

int32_t ll_ftp_msg_process(ll_ftp_t* f, uint8_t* buf, uint8_t len)
{
    int32_t ret = 0;
    switch (f->state)
    {
        case IDLE:
            ret = ll_ftp_idle_process_msg(f, buf, len);
            break;
        case SEGMENT:
            ret = ll_ftp_segment_process_msg(f, buf, len);
            break;
        case APPLY:
            ret = ll_ftp_apply_process_msg(f, buf, len);
            break;
        default:
            ret = LL_FTP_ERROR;
            break;
    }

    return ret;
}